

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

uint32_t roaring_bitmap_maximum(roaring_bitmap_t *bm)

{
  long *plVar1;
  ulong uVar2;
  uint uVar3;
  short sVar4;
  int *piVar5;
  uint8_t uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  
  iVar10 = (bm->high_low_container).size;
  if (iVar10 < 1) {
    return 0;
  }
  uVar3 = iVar10 - 1;
  piVar5 = (int *)(bm->high_low_container).containers[uVar3];
  uVar6 = (bm->high_low_container).typecodes[uVar3];
  if (uVar6 == '\x04') {
    uVar6 = (uint8_t)piVar5[2];
    if (uVar6 == '\x04') {
      __assert_fail("*type != SHARED_CONTAINER_TYPE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1062,
                    "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
    }
    piVar5 = *(int **)piVar5;
  }
  if (uVar6 == '\x03') {
    lVar7 = (long)*piVar5;
    if (lVar7 != 0) {
      sVar4 = *(short *)(*(long *)(piVar5 + 2) + -2 + lVar7 * 4) +
              *(short *)(*(long *)(piVar5 + 2) + -4 + lVar7 * 4);
      goto LAB_0011cad0;
    }
  }
  else if (uVar6 == '\x02') {
    if ((long)*piVar5 != 0) {
      sVar4 = *(short *)(*(long *)(piVar5 + 2) + -2 + (long)*piVar5 * 2);
      goto LAB_0011cad0;
    }
  }
  else {
    if (uVar6 != '\x01') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x18c4,"uint16_t container_maximum(const container_t *, uint8_t)");
    }
    plVar1 = (long *)(piVar5 + 2);
    uVar9 = 0x400;
    iVar10 = 0xffff;
    do {
      uVar8 = (int)uVar9 - 1;
      uVar9 = (ulong)uVar8;
      uVar2 = *(ulong *)(*plVar1 + uVar9 * 8);
      lVar7 = 0x3f;
      if (uVar2 != 0) {
        for (; uVar2 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      piVar5 = (int *)((ulong)piVar5 & 0xffffffff);
      if (uVar2 != 0) {
        piVar5 = (int *)(ulong)(iVar10 - ((uint)lVar7 ^ 0x3f));
      }
      sVar4 = (short)piVar5;
      if (uVar2 != 0) goto LAB_0011cad0;
      iVar10 = iVar10 + -0x40;
    } while (1 < uVar8);
  }
  sVar4 = 0;
LAB_0011cad0:
  return CONCAT22((bm->high_low_container).keys[uVar3],sVar4);
}

Assistant:

uint32_t roaring_bitmap_maximum(const roaring_bitmap_t *bm) {
    if (bm->high_low_container.size > 0) {
        container_t *container =
            bm->high_low_container.containers[bm->high_low_container.size - 1];
        uint8_t typecode =
            bm->high_low_container.typecodes[bm->high_low_container.size - 1];
        uint32_t key =
            bm->high_low_container.keys[bm->high_low_container.size - 1];
        uint32_t lowvalue = container_maximum(container, typecode);
        return lowvalue | (key << 16);
    }
    return 0;
}